

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_19c5bf5::ReaderSpy::read(ReaderSpy *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  long lVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  string local_50 [8];
  string buf;
  char *chars;
  size_t c;
  size_t n_local;
  void *buffer_local;
  ReaderSpy *this_local;
  
  peVar1 = std::__shared_ptr_access<dap::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dap::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->r);
  lVar2 = (**(code **)((long)*peVar1 + 0x20))(peVar1,CONCAT44(in_register_00000034,__fd),__buf);
  if (lVar2 != 0) {
    buf.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
    std::__cxx11::string::string(local_50,(string *)&this->prefix);
    std::__cxx11::string::append<char_const*,void>
              (local_50,(char *)buf.field_2._8_8_,(char *)(buf.field_2._8_8_ + lVar2));
    peVar3 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->s);
    uVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    (**(code **)((long)*peVar3 + 0x20))(peVar3,uVar4,uVar5);
    std::__cxx11::string::~string(local_50);
  }
  return lVar2;
}

Assistant:

size_t read(void* buffer, size_t n) override {
    auto c = r->read(buffer, n);
    if (c > 0) {
      auto chars = reinterpret_cast<const char*>(buffer);
      std::string buf = prefix;
      buf.append(chars, chars + c);
      s->write(buf.data(), buf.size());
    }
    return c;
  }